

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O0

bool __thiscall pbrt::TransformedPrimitive::IntersectP(TransformedPrimitive *this,Ray *r,Float tMax)

{
  bool bVar1;
  Ray ray;
  Float *in_stack_000000a8;
  Ray *in_stack_000000b0;
  Transform *in_stack_000000b8;
  Float in_stack_ffffffffffffffd4;
  Ray *in_stack_ffffffffffffffd8;
  PrimitiveHandle *in_stack_ffffffffffffffe0;
  
  Transform::ApplyInverse(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  bVar1 = PrimitiveHandle::IntersectP
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  return bVar1;
}

Assistant:

bool TransformedPrimitive::IntersectP(const Ray &r, Float tMax) const {
    Ray ray = renderFromPrimitive->ApplyInverse(r, &tMax);
    return primitive.IntersectP(ray, tMax);
}